

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

void __thiscall
jbcoin::STObject::set
          (STObject *this,unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *v)

{
  STBase *pSVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  STVar SStack_78;
  
  iVar2 = getFieldIndex(this,((v->_M_t).
                              super___uniq_ptr_impl<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>
                              .super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl)->fName);
  if (iVar2 != -1) {
    pSVar1 = (v->_M_t).super___uniq_ptr_impl<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>.
             _M_t.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
             super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl;
    SStack_78.p_ = (STBase *)0x0;
    iVar3 = (*pSVar1->_vptr_STBase[3])(pSVar1,0x48,&SStack_78);
    SStack_78.p_ = (STBase *)CONCAT44(extraout_var,iVar3);
    detail::STVar::operator=
              ((this->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start + iVar2,&SStack_78);
    detail::STVar::~STVar(&SStack_78);
    return;
  }
  if (this->mType == (SOTemplate *)0x0) {
    std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
    emplace_back<jbcoin::STBase>
              (&this->v_,
               (v->_M_t).super___uniq_ptr_impl<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_>
               ._M_t.super__Tuple_impl<0UL,_jbcoin::STBase_*,_std::default_delete<jbcoin::STBase>_>.
               super__Head_base<0UL,_jbcoin::STBase_*,_false>._M_head_impl);
    return;
  }
  Throw<std::runtime_error,char_const(&)[36]>((char (*) [36])"missing field in templated STObject");
}

Assistant:

void
STObject::set (std::unique_ptr<STBase> v)
{
    auto const i =
        getFieldIndex(v->getFName());
    if (i != -1)
    {
        v_[i] = std::move(*v);
    }
    else
    {
        if (! isFree())
            Throw<std::runtime_error> (
                "missing field in templated STObject");
        v_.emplace_back(std::move(*v));
    }
}